

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall
glslang::TPpContext::evalToToken
          (TPpContext *this,int token,bool shortCircuit,int *res,bool *err,TPpToken *ppToken)

{
  int iVar1;
  MacroExpandResult MVar2;
  bool bVar3;
  char *message;
  TPpToken *ppToken_local;
  bool *err_local;
  int *res_local;
  bool shortCircuit_local;
  int token_local;
  TPpContext *this_local;
  
  res_local._4_4_ = token;
  do {
    bVar3 = false;
    if (res_local._4_4_ == 0xa2) {
      iVar1 = strcmp("defined",ppToken->name);
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) {
      return res_local._4_4_;
    }
    MVar2 = MacroExpand(this,ppToken,true,false);
    if (MVar2 < MacroExpandStarted) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"can\'t evaluate expression","preprocessor evaluation",
                 "");
      *err = true;
      *res = 0;
    }
    else if ((((MVar2 != MacroExpandStarted) && (MVar2 == MacroExpandUndef)) && (!shortCircuit)) &&
            (bVar3 = TParseVersions::isEsProfile(&this->parseContext->super_TParseVersions), bVar3))
    {
      bVar3 = TParseVersions::relaxedErrors(&this->parseContext->super_TParseVersions);
      if (bVar3) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x30])
                  (this->parseContext,ppToken,
                   "undefined macro in expression not allowed in es profile",
                   "preprocessor evaluation",ppToken->name);
      }
      else {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,
                   "undefined macro in expression not allowed in es profile",
                   "preprocessor evaluation",ppToken->name);
      }
    }
    res_local._4_4_ = scanToken(this,ppToken);
  } while ((*err & 1U) == 0);
  return res_local._4_4_;
}

Assistant:

int TPpContext::evalToToken(int token, bool shortCircuit, int& res, bool& err, TPpToken* ppToken)
{
    while (token == PpAtomIdentifier && strcmp("defined", ppToken->name) != 0) {
        switch (MacroExpand(ppToken, true, false)) {
        case MacroExpandNotStarted:
        case MacroExpandError:
            parseContext.ppError(ppToken->loc, "can't evaluate expression", "preprocessor evaluation", "");
            err = true;
            res = 0;
            break;
        case MacroExpandStarted:
            break;
        case MacroExpandUndef:
            if (! shortCircuit && parseContext.isEsProfile()) {
                const char* message = "undefined macro in expression not allowed in es profile";
                if (parseContext.relaxedErrors())
                    parseContext.ppWarn(ppToken->loc, message, "preprocessor evaluation", ppToken->name);
                else
                    parseContext.ppError(ppToken->loc, message, "preprocessor evaluation", ppToken->name);
            }
            break;
        }
        token = scanToken(ppToken);
        if (err)
            break;
    }

    return token;
}